

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Prs_ManWriteVerilogArray(FILE *pFile,Prs_Ntk_t *p,Vec_Int_t *vSigs,int fOdd)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  int fFirst;
  int Sig;
  int i;
  int fOdd_local;
  Vec_Int_t *vSigs_local;
  Prs_Ntk_t *p_local;
  FILE *pFile_local;
  
  bVar1 = true;
  iVar3 = Vec_IntSize(vSigs);
  if (0 < iVar3) {
    for (fFirst = 0; iVar3 = Vec_IntSize(vSigs), fFirst < iVar3; fFirst = fFirst + 1) {
      iVar3 = Vec_IntEntry(vSigs,fFirst);
      if ((fOdd == 0) || ((fFirst & 1U) != 0)) {
        pcVar2 = "    \"%s\", ";
        if (bVar1) {
          pcVar2 = "T = %d\t\t";
        }
        fprintf((FILE *)pFile,"%s",pcVar2 + 8);
        Prs_ManWriteVerilogSignal(pFile,p,iVar3);
        bVar1 = false;
      }
    }
    return;
  }
  __assert_fail("Vec_IntSize(vSigs) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                ,0xc2,"void Prs_ManWriteVerilogArray(FILE *, Prs_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Prs_ManWriteVerilogArray( FILE * pFile, Prs_Ntk_t * p, Vec_Int_t * vSigs, int fOdd )
{
    int i, Sig, fFirst = 1;
    assert( Vec_IntSize(vSigs) > 0 );
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        if ( fOdd && !(i & 1) )
            continue;
        fprintf( pFile, "%s", fFirst ? "" : ", " );
        Prs_ManWriteVerilogSignal( pFile, p, Sig );
        fFirst = 0;
    }
}